

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void leaveblock(FuncState *fs)

{
  long in_RDI;
  BlockCnt *bl;
  int in_stack_ffffffffffffffe8;
  OpCode in_stack_ffffffffffffffec;
  FuncState *fs_00;
  
  fs_00 = *(FuncState **)(in_RDI + 0x28);
  *(Proto **)(in_RDI + 0x28) = fs_00->f;
  removevars(*(LexState **)(in_RDI + 0x18),(uint)*(byte *)((long)&fs_00->h + 4));
  if (*(char *)((long)&fs_00->h + 5) != '\0') {
    luaK_codeABC(fs_00,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8,0,0x1195b8);
  }
  *(uint *)(in_RDI + 0x3c) = (uint)*(byte *)(in_RDI + 0x4a);
  luaK_patchtohere(fs_00,in_stack_ffffffffffffffec);
  return;
}

Assistant:

static void leaveblock(FuncState*fs){
BlockCnt*bl=fs->bl;
fs->bl=bl->previous;
removevars(fs->ls,bl->nactvar);
if(bl->upval)
luaK_codeABC(fs,OP_CLOSE,bl->nactvar,0,0);
fs->freereg=fs->nactvar;
luaK_patchtohere(fs,bl->breaklist);
}